

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O0

void __thiscall E64::core_t::do_sound_and_timers(core_t *this,uint32_t cycles)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  int in_ESI;
  undefined8 *in_RDI;
  uint32_t cycles_done;
  uint32_t in_stack_0000001c;
  sound_ic *in_stack_00000020;
  int local_c;
  
  local_c = in_ESI;
  if (*(int *)(in_RDI + 0xc) == 2) {
    while (iVar4 = local_c + -1, local_c != 0) {
      uVar2 = timer_t::clock((timer_t *)(in_RDI + 0x11));
      if ((uVar2 & 1) != 0) {
        sound_ic::run(in_stack_00000020,in_stack_0000001c,(host_t *)this);
        lua_getglobal((lua_State *)*in_RDI,"timer0_callback");
        iVar1 = lua_pcallk((lua_State *)*in_RDI,0,0,0,0,(lua_KFunction)0x0);
        if (iVar1 != 0) {
          pcVar3 = lua_tolstring((lua_State *)*in_RDI,-1,(size_t *)0x0);
          printf("[core] Lua error: %s",pcVar3);
        }
      }
      uVar2 = timer_t::clock((timer_t *)(in_RDI + 0x14));
      if ((uVar2 & 1) != 0) {
        sound_ic::run(in_stack_00000020,in_stack_0000001c,(host_t *)this);
        lua_getglobal((lua_State *)*in_RDI,"timer1_callback");
        iVar1 = lua_pcallk((lua_State *)*in_RDI,0,0,0,0,(lua_KFunction)0x0);
        if (iVar1 != 0) {
          pcVar3 = lua_tolstring((lua_State *)*in_RDI,-1,(size_t *)0x0);
          printf("[core] Lua error: %s",pcVar3);
        }
      }
      uVar2 = timer_t::clock((timer_t *)(in_RDI + 0x17));
      if ((uVar2 & 1) != 0) {
        sound_ic::run(in_stack_00000020,in_stack_0000001c,(host_t *)this);
        lua_getglobal((lua_State *)*in_RDI,"timer2_callback");
        iVar1 = lua_pcallk((lua_State *)*in_RDI,0,0,0,0,(lua_KFunction)0x0);
        if (iVar1 != 0) {
          pcVar3 = lua_tolstring((lua_State *)*in_RDI,-1,(size_t *)0x0);
          printf("[core] Lua error: %s",pcVar3);
        }
      }
      uVar2 = timer_t::clock((timer_t *)(in_RDI + 0x1a));
      if ((uVar2 & 1) != 0) {
        sound_ic::run(in_stack_00000020,in_stack_0000001c,(host_t *)this);
        lua_getglobal((lua_State *)*in_RDI,"timer3_callback");
        iVar1 = lua_pcallk((lua_State *)*in_RDI,0,0,0,0,(lua_KFunction)0x0);
        if (iVar1 != 0) {
          pcVar3 = lua_tolstring((lua_State *)*in_RDI,-1,(size_t *)0x0);
          printf("[core] Lua error: %s",pcVar3);
        }
      }
      uVar2 = timer_t::clock((timer_t *)(in_RDI + 0x1d));
      if ((uVar2 & 1) != 0) {
        sound_ic::run(in_stack_00000020,in_stack_0000001c,(host_t *)this);
        lua_getglobal((lua_State *)*in_RDI,"timer4_callback");
        iVar1 = lua_pcallk((lua_State *)*in_RDI,0,0,0,0,(lua_KFunction)0x0);
        if (iVar1 != 0) {
          pcVar3 = lua_tolstring((lua_State *)*in_RDI,-1,(size_t *)0x0);
          printf("[core] Lua error: %s",pcVar3);
        }
      }
      uVar2 = timer_t::clock((timer_t *)(in_RDI + 0x20));
      if ((uVar2 & 1) != 0) {
        sound_ic::run(in_stack_00000020,in_stack_0000001c,(host_t *)this);
        lua_getglobal((lua_State *)*in_RDI,"timer5_callback");
        iVar1 = lua_pcallk((lua_State *)*in_RDI,0,0,0,0,(lua_KFunction)0x0);
        if (iVar1 != 0) {
          pcVar3 = lua_tolstring((lua_State *)*in_RDI,-1,(size_t *)0x0);
          printf("[core] Lua error: %s",pcVar3);
        }
      }
      uVar2 = timer_t::clock((timer_t *)(in_RDI + 0x23));
      if ((uVar2 & 1) != 0) {
        sound_ic::run(in_stack_00000020,in_stack_0000001c,(host_t *)this);
        lua_getglobal((lua_State *)*in_RDI,"timer6_callback");
        iVar1 = lua_pcallk((lua_State *)*in_RDI,0,0,0,0,(lua_KFunction)0x0);
        if (iVar1 != 0) {
          pcVar3 = lua_tolstring((lua_State *)*in_RDI,-1,(size_t *)0x0);
          printf("[core] Lua error: %s",pcVar3);
        }
      }
      uVar2 = timer_t::clock((timer_t *)(in_RDI + 0x26));
      local_c = iVar4;
      if ((uVar2 & 1) != 0) {
        sound_ic::run(in_stack_00000020,in_stack_0000001c,(host_t *)this);
        lua_getglobal((lua_State *)*in_RDI,"timer7_callback");
        iVar4 = lua_pcallk((lua_State *)*in_RDI,0,0,0,0,(lua_KFunction)0x0);
        if (iVar4 != 0) {
          pcVar3 = lua_tolstring((lua_State *)*in_RDI,-1,(size_t *)0x0);
          printf("[core] Lua error: %s",pcVar3);
        }
      }
    }
  }
  sound_ic::run(in_stack_00000020,in_stack_0000001c,(host_t *)this);
  return;
}

Assistant:

void E64::core_t::do_sound_and_timers(uint32_t cycles)
{
	uint32_t cycles_done = 0;
	
	if (current_mode == RUN) {
		while (cycles--) {
			if (timer[0].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer0_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[1].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer1_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[2].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer2_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[3].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer3_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[4].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer4_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[5].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer5_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[6].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer6_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[7].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer7_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			cycles_done++;
		}
	} else {
		cycles_done = cycles;
	}
	
	sound->run(cycles_done, host);
}